

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd,GlobalFederateId dest)

{
  bool bVar1;
  FederateStates FVar2;
  GlobalFederateId GVar3;
  route_id rVar4;
  FederateState *this_00;
  FederateState *pFVar5;
  BaseType in_EDX;
  long in_RSI;
  long *in_RDI;
  route_id route;
  optional<helics::ActionMessage> rep;
  FederateState *fed;
  ActionMessage *in_stack_00000168;
  CommonCore *in_stack_00000170;
  ActionMessage *in_stack_00000358;
  TranslatorFederate *in_stack_00000360;
  ActionMessage *in_stack_00000468;
  FilterFederate *in_stack_00000470;
  ActionMessage *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  GlobalFederateId in_stack_fffffffffffffef0;
  CommonCore *in_stack_fffffffffffffef8;
  GlobalFederateId in_stack_ffffffffffffff04;
  CommonCore *in_stack_ffffffffffffff08;
  GlobalFederateId in_stack_ffffffffffffff14;
  ActionMessage *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  GlobalFederateId local_4;
  
  local_4.gid = in_EDX;
  bVar1 = GlobalFederateId::isValid(&local_4);
  if (bVar1) {
    *(BaseType *)(in_RSI + 0x10) = local_4.gid;
    bVar1 = GlobalFederateId::operator==(&local_4,(GlobalBrokerId)0x0);
    if ((bVar1) ||
       (bVar1 = GlobalFederateId::operator==(&local_4,(GlobalBrokerId)(BaseType)in_RDI[3]), bVar1))
    {
      (**(code **)(*in_RDI + 0x358))(in_RDI,0,in_RSI);
    }
    else {
      bVar1 = GlobalFederateId::operator==
                        ((GlobalFederateId *)(in_RSI + 0x10),
                         (GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
      if (bVar1) {
        processCommandsForCore(in_stack_00000170,in_stack_00000168);
      }
      else {
        this_00 = (FederateState *)(in_RSI + 0x10);
        GVar3 = std::atomic::operator_cast_to_GlobalFederateId
                          ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffec8);
        bVar1 = GlobalFederateId::operator==((GlobalFederateId *)this_00,GVar3);
        if (bVar1) {
          FilterFederate::handleMessage(in_stack_00000470,in_stack_00000468);
        }
        else {
          GVar3 = std::atomic::operator_cast_to_GlobalFederateId
                            ((atomic<helics::GlobalFederateId> *)in_stack_fffffffffffffec8);
          bVar1 = GlobalFederateId::operator==(&local_4,GVar3);
          if (bVar1) {
            TranslatorFederate::handleMessage(in_stack_00000360,in_stack_00000358);
          }
          else {
            bVar1 = isLocal(in_stack_fffffffffffffef8,in_stack_ffffffffffffff04);
            if (bVar1) {
              pFVar5 = getFederateCore(in_stack_ffffffffffffff08,in_stack_ffffffffffffff14);
              if (pFVar5 != (FederateState *)0x0) {
                FVar2 = FederateState::getState((FederateState *)0x56ce1d);
                if (FVar2 == FINISHED) {
                  FederateState::processPostTerminationAction
                            ((FederateState *)CONCAT44(local_4.gid,in_stack_ffffffffffffffb8),
                             in_stack_ffffffffffffffb0);
                  bVar1 = std::optional::operator_cast_to_bool
                                    ((optional<helics::ActionMessage> *)0x56ce5c);
                  if (bVar1) {
                    std::optional<helics::ActionMessage>::operator*
                              ((optional<helics::ActionMessage> *)0x56ce6c);
                    routeMessage(in_stack_00000170,in_stack_00000168);
                  }
                  std::optional<helics::ActionMessage>::~optional
                            ((optional<helics::ActionMessage> *)0x56cea1);
                }
                else {
                  FederateState::addAction(this_00,in_stack_fffffffffffffec8);
                }
              }
            }
            else {
              rVar4 = getRoute((CommonCore *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                               in_stack_fffffffffffffef0);
              (**(code **)(*in_RDI + 0x358))(in_RDI,rVar4.rid,in_RSI);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::routeMessage(ActionMessage&& cmd, GlobalFederateId dest)
{
    if (!dest.isValid()) {
        return;
    }
    cmd.dest_id = dest;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (cmd.dest_id == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (cmd.dest_id == filterFedID) {
        filterFed->handleMessage(cmd);
    } else if (dest == translatorFedID) {
        translatorFed->handleMessage(cmd);
    } else if (isLocal(dest)) {
        auto* fed = getFederateCore(dest);
        if (fed != nullptr) {
            if (fed->getState() != FederateStates::FINISHED) {
                fed->addAction(std::move(cmd));
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(dest);
        transmit(route, cmd);
    }
}